

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O0

void getLibraryPath(void *symbol,char **path,uint *pathLength)

{
  uchar uVar1;
  size_t sVar2;
  char *pcStack_40;
  uint len;
  Dl_info dlInfo;
  uint *pathLength_local;
  char **path_local;
  void *symbol_local;
  
  dlInfo.dli_saddr = pathLength;
  uVar1 = checkStringOutParameter(path,pathLength);
  if (uVar1 != '\0') {
    if (symbol == (void *)0x0) {
      invalidateStringOutParameter(path,(uint *)dlInfo.dli_saddr);
    }
    else {
      dladdr(symbol,&stack0xffffffffffffffc0);
      if (pcStack_40 == (char *)0x0) {
        invalidateStringOutParameter(path,(uint *)dlInfo.dli_saddr);
      }
      else {
        sVar2 = strlen(pcStack_40);
        copyToStringOutParameter(pcStack_40,(uint)sVar2,path,(uint *)dlInfo.dli_saddr);
      }
    }
  }
  return;
}

Assistant:

void getLibraryPath(void * symbol, char ** path, unsigned int * pathLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    if (!symbol)
    {
        invalidateStringOutParameter(path, pathLength);
        return;
    }

#if defined SYSTEM_WINDOWS

    char systemPath[MAX_PATH];
    systemPath[0] = '\0';

    HMODULE module;

    if (GetModuleHandleExA(
            GET_MODULE_HANDLE_EX_FLAG_FROM_ADDRESS | GET_MODULE_HANDLE_EX_FLAG_UNCHANGED_REFCOUNT,
            (LPCSTR)symbol,
            &module))
    {
        GetModuleFileNameA(module, systemPath, MAX_PATH);
    }

    unsigned int len = (unsigned int)strnlen(systemPath, MAX_PATH);

    copyToStringOutParameter(systemPath, len, path, pathLength);

#else

    Dl_info dlInfo;
    dladdr(symbol, &dlInfo);

    if (!dlInfo.dli_fname)
    {
        invalidateStringOutParameter(path, pathLength);
        return;
    }

    unsigned int len = strlen(dlInfo.dli_fname);
    copyToStringOutParameter(dlInfo.dli_fname, len, path, pathLength);

#endif

    // Return path with system path delimiters
    // unifyPathDelimiters(*path, *pathLength);
}